

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

VOID PROCCleanupInitialProcess(void)

{
  CPalThread *pThread_00;
  CPalThread *pThread;
  
  pThread_00 = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread_00,&g_csProcess);
  free(g_lpwstrAppDir);
  free(g_lpwstrCmdLine);
  CorUnix::InternalLeaveCriticalSection(pThread_00,&g_csProcess);
  return;
}

Assistant:

VOID
PROCCleanupInitialProcess(VOID)
{
    CPalThread *pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, &g_csProcess);

    /* Free the application directory */
    free(g_lpwstrAppDir);

    /* Free the stored command line */
    free(g_lpwstrCmdLine);

    InternalLeaveCriticalSection(pThread, &g_csProcess);

    //
    // Object manager shutdown will handle freeing the underlying
    // thread and process data
    //

}